

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int lws_chunked_html_process(lws_process_html_args *args,lws_process_html_state *s)

{
  char cVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  size_t sVar13;
  char buffer [32];
  int local_84;
  char local_58 [40];
  
  pcVar11 = args->p;
  local_84 = args->len;
  lVar9 = (long)local_84;
  args->len = 0;
  s->start = pcVar11;
  if (0 < lVar9) {
    pcVar5 = pcVar11 + lVar9;
    do {
      iVar6 = args->len + 7;
      lVar9 = (long)pcVar11 - lVar9;
      while( true ) {
        lVar9 = lVar9 + 1;
        if (args->max_len <= iVar6) {
          _lws_log(1,"Used up interpret padding\n");
          return -1;
        }
        iVar4 = s->pos;
        if ((long)iVar4 != 0) goto LAB_0013753a;
        if ((iVar4 != 0) || (*pcVar11 == '$')) break;
        args->len = iVar6 + -6;
        pcVar11 = pcVar11 + 1;
        iVar6 = iVar6 + 1;
        if (pcVar5 <= pcVar11) goto LAB_001376db;
      }
      if (iVar4 == 0) {
        s->start = pcVar11;
      }
LAB_0013753a:
      cVar1 = *pcVar11;
      s->pos = iVar4 + 1;
      s->swallow[iVar4] = cVar1;
      iVar6 = s->pos;
      sVar13 = (size_t)iVar6;
      if (sVar13 == 0xf) {
LAB_00137695:
        s->swallow[sVar13] = '\0';
        memcpy(s->start,s->swallow,(long)s->pos);
        args->len = args->len + 1;
        s->pos = 0;
        pcVar11 = s->start;
      }
      else {
        iVar4 = s->count_vars;
        if ((long)iVar4 < 1) {
          iVar12 = 0;
          iVar7 = 0;
        }
        else {
          ppcVar2 = s->vars;
          uVar10 = 0;
          uVar8 = 0;
          iVar12 = 0;
          do {
            iVar3 = strncmp(s->swallow,ppcVar2[uVar10],sVar13);
            if (iVar3 == 0) {
              uVar8 = uVar10 & 0xffffffff;
            }
            iVar7 = (int)uVar8;
            iVar12 = iVar12 + (uint)(iVar3 == 0);
            uVar10 = uVar10 + 1;
          } while ((long)iVar4 != uVar10);
        }
        if (iVar12 == 0) goto LAB_00137695;
        if ((iVar12 == 1) && (sVar13 = strlen(s->vars[iVar7]), iVar6 == (int)sVar13)) {
          pcVar11 = (*s->replace)(s->data,iVar7);
          if (pcVar11 == (char *)0x0) {
            pcVar11 = "NULL";
          }
          sVar13 = strlen(pcVar11);
          s->swallow[s->pos] = '\0';
          iVar6 = (int)sVar13;
          if (s->pos != iVar6) {
            memmove(s->start + iVar6,s->start + s->pos,(long)args->p - lVar9);
            local_84 = ((local_84 + iVar6) - s->pos) + 1;
          }
          memcpy(s->start,pcVar11,(long)iVar6);
          args->len = args->len + 1;
          pcVar11 = s->start + 1;
          s->pos = 0;
        }
      }
      pcVar11 = pcVar11 + 1;
      lVar9 = (long)local_84;
      pcVar5 = args->p + lVar9;
    } while (pcVar11 < pcVar5);
  }
LAB_001376db:
  if (args->chunked == 0) {
    iVar6 = 0;
  }
  else if ((args->final == 0) || (iVar6 = -1, args->len + 7 < args->max_len)) {
    iVar6 = 0;
    iVar4 = sprintf(local_58,"%X\r\n",(ulong)(uint)args->len);
    pcVar11 = args->p;
    sVar13 = (size_t)iVar4;
    args->p = pcVar11 + -sVar13;
    memcpy(pcVar11 + -sVar13,local_58,sVar13);
    iVar4 = args->len;
    lVar9 = (long)iVar4 + sVar13;
    args->len = (int)lVar9;
    iVar7 = args->final;
    pcVar11 = args->p;
    pcVar11[lVar9] = '\r';
    if (iVar7 == 0) {
      pcVar11[lVar9 + 1] = '\n';
      args->len = args->len + 2;
    }
    else {
      builtin_strncpy(pcVar11 + (long)iVar4 + sVar13 + 1,"\n0\r\n\r\n",6);
      args->len = args->len + 7;
    }
  }
  return iVar6;
}

Assistant:

int
lws_chunked_html_process(struct lws_process_html_args *args,
			 struct lws_process_html_state *s)
{
	char *sp, buffer[32];
	const char *pc;
	int old_len, n;

	/* do replacements */
	sp = args->p;
	old_len = args->len;
	args->len = 0;
	s->start = sp;
	while (sp < args->p + old_len) {

		if (args->len + 7 >= args->max_len) {
			lwsl_err("Used up interpret padding\n");
			return -1;
		}

		if ((!s->pos && *sp == '$') || s->pos) {
			int hits = 0, hit = 0;

			if (!s->pos)
				s->start = sp;
			s->swallow[s->pos++] = *sp;
			if (s->pos == sizeof(s->swallow) - 1)
				goto skip;
			for (n = 0; n < s->count_vars; n++)
				if (!strncmp(s->swallow, s->vars[n], s->pos)) {
					hits++;
					hit = n;
				}
			if (!hits) {
skip:
				s->swallow[s->pos] = '\0';
				memcpy(s->start, s->swallow, s->pos);
				args->len++;
				s->pos = 0;
				sp = s->start + 1;
				continue;
			}
			if (hits == 1 && s->pos == (int)strlen(s->vars[hit])) {
				pc = s->replace(s->data, hit);
				if (!pc)
					pc = "NULL";
				n = (int)strlen(pc);
				s->swallow[s->pos] = '\0';
				if (n != s->pos) {
					memmove(s->start + n, s->start + s->pos,
						old_len - (sp - args->p) - 1);
					old_len += (n - s->pos) + 1;
				}
				memcpy(s->start, pc, n);
				args->len++;
				sp = s->start + 1;

				s->pos = 0;
			}
			sp++;
			continue;
		}

		args->len++;
		sp++;
	}

	if (args->chunked) {
		/* no space left for final chunk trailer */
		if (args->final && args->len + 7 >= args->max_len)
			return -1;

		n = sprintf(buffer, "%X\x0d\x0a", args->len);

		args->p -= n;
		memcpy(args->p, buffer, n);
		args->len += n;

		if (args->final) {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '0';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 7;
		} else {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 2;
		}
	}

	return 0;
}